

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall StaticContentsSock::StaticContentsSock(StaticContentsSock *this,string *contents)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sock::Sock(&this->super_Sock,0xffffffff);
  (this->super_Sock)._vptr_Sock = (_func_int **)&PTR__StaticContentsSock_01149ac0;
  std::__cxx11::string::string((string *)&this->m_contents,contents);
  this->m_consumed = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit StaticContentsSock(const std::string& contents)
        : Sock{INVALID_SOCKET},
          m_contents{contents}
    {
    }